

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::AddVariableDefinition(cmCTest *this,string *arg)

{
  bool bVar1;
  mapped_type *pmVar2;
  CacheEntryType type;
  string value;
  string name;
  CacheEntryType local_64;
  string local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_64 = UNINITIALIZED;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar1 = cmake::ParseCacheEntry(arg,&local_40,&local_60,&local_64);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->Impl)._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                           Definitions,&local_40);
    std::__cxx11::string::_M_assign((string *)pmVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmCTest::AddVariableDefinition(const std::string& arg)
{
  std::string name;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;

  if (cmake::ParseCacheEntry(arg, name, value, type)) {
    this->Impl->Definitions[name] = value;
    return true;
  }

  return false;
}